

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Jupiter::Socket::setBlocking(Socket *this,bool mode)

{
  int iVar1;
  uint local_20;
  int flags;
  bool mode_local;
  Socket *this_local;
  
  local_20 = fcntl(this->m_data->rawSock,3,0);
  if ((int)local_20 < 0) {
    this_local._7_1_ = false;
  }
  else {
    if (mode) {
      local_20 = local_20 & 0xfffff7ff;
    }
    else {
      local_20 = local_20 | 0x800;
    }
    iVar1 = fcntl(this->m_data->rawSock,4,(ulong)local_20);
    this_local._7_1_ = iVar1 == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool Jupiter::Socket::setBlocking(bool mode) {
#if defined _WIN32
	m_data->blockMode = !mode;
	return ioctlsocket(m_data->rawSock, FIONBIO, &m_data->blockMode) == 0;
#else // _WIN32
	int flags = fcntl(m_data->rawSock, F_GETFL, 0);
	if (flags < 0) return 0;
	if (mode) {
		flags &= ~O_NONBLOCK;
	}
	else {
		flags |= O_NONBLOCK;
	}
	return fcntl(m_data->rawSock, F_SETFL, flags) == 0;
#endif // _WIN32
}